

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corruption_test.cc
# Opt level: O0

void __thiscall leveldb::_Test_TableFileIndexData::_Run(_Test_TableFileIndexData *this)

{
  DB *local_18;
  DBImpl *dbi;
  _Test_TableFileIndexData *this_local;
  
  dbi = (DBImpl *)this;
  CorruptionTest::Build(&this->super_CorruptionTest,10000);
  local_18 = (this->super_CorruptionTest).db_;
  DBImpl::TEST_CompactMemTable((DBImpl *)&stack0xffffffffffffffe0);
  Status::~Status((Status *)&stack0xffffffffffffffe0);
  CorruptionTest::Corrupt(&this->super_CorruptionTest,kTableFile,-2000,500);
  CorruptionTest::Reopen(&this->super_CorruptionTest);
  CorruptionTest::Check(&this->super_CorruptionTest,5000,9999);
  return;
}

Assistant:

TEST(CorruptionTest, TableFileIndexData) {
  Build(10000);  // Enough to build multiple Tables
  DBImpl* dbi = reinterpret_cast<DBImpl*>(db_);
  dbi->TEST_CompactMemTable();

  Corrupt(kTableFile, -2000, 500);
  Reopen();
  Check(5000, 9999);
}